

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O0

void init_tx(ixgbe_device *dev)

{
  uint32_t uVar1;
  undefined8 *puVar2;
  long in_RDI;
  dma_memory dVar3;
  ixgbe_tx_queue *queue;
  uint32_t txdctl;
  dma_memory mem;
  uint32_t ring_size_bytes;
  uint16_t i_1;
  int i;
  undefined1 in_stack_00001a8f;
  size_t in_stack_00001a90;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *local_28;
  uintptr_t local_20;
  ushort local_e;
  int local_c;
  
  set_flags32((uint8_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
              (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(uint32_t)in_stack_ffffffffffffffc8);
  set_reg32(*(uint8_t **)(in_RDI + 0x70),0xcc00,0xa000);
  for (local_c = 1; local_c < 8; local_c = local_c + 1) {
    set_reg32(*(uint8_t **)(in_RDI + 0x70),local_c * 4 + 0xcc00,0);
  }
  set_reg32(*(uint8_t **)(in_RDI + 0x70),0x8100,0xffff);
  clear_flags32((uint8_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(uint32_t)in_stack_ffffffffffffffc8)
  ;
  for (local_e = 0; local_e < *(ushort *)(in_RDI + 0x12); local_e = local_e + 1) {
    fprintf(_stderr,"[DEBUG] %s:%d %s(): initializing tx queue %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
            0x192,"init_tx",(ulong)local_e);
    dVar3 = memory_allocate_dma(in_stack_00001a90,(_Bool)in_stack_00001a8f);
    local_28 = dVar3.virt;
    memset(local_28,0xff,0x2000);
    local_20 = dVar3.phy;
    set_reg32(*(uint8_t **)(in_RDI + 0x70),(uint)local_e * 0x40 + 0x6000,(uint32_t)dVar3.phy);
    set_reg32(*(uint8_t **)(in_RDI + 0x70),(uint)local_e * 0x40 + 0x6004,dVar3.phy._4_4_);
    set_reg32(*(uint8_t **)(in_RDI + 0x70),(uint)local_e * 0x40 + 0x6008,0x2000);
    fprintf(_stderr,"[DEBUG] %s:%d %s(): tx ring %d phy addr:  0x%012lX\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
            0x19c,"init_tx",(ulong)local_e,local_20);
    fprintf(_stderr,"[DEBUG] %s:%d %s(): tx ring %d virt addr: 0x%012lX\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
            0x19d,"init_tx",(ulong)local_e,local_28);
    uVar1 = get_reg32(*(uint8_t **)(in_RDI + 0x70),(uint)local_e * 0x40 + 0x6028);
    set_reg32(*(uint8_t **)(in_RDI + 0x70),(uint)local_e * 0x40 + 0x6028,
              uVar1 & 0xff808080 | 0x40824);
    puVar2 = (undefined8 *)(*(long *)(in_RDI + 0x80) + (long)(int)(uint)local_e * 0x10);
    *(undefined2 *)(puVar2 + 1) = 0x200;
    *puVar2 = local_28;
  }
  set_reg32(*(uint8_t **)(in_RDI + 0x70),0x4a80,1);
  return;
}

Assistant:

static void init_tx(struct ixgbe_device* dev) {
	// crc offload and small packet padding
	set_flags32(dev->addr, IXGBE_HLREG0, IXGBE_HLREG0_TXCRCEN | IXGBE_HLREG0_TXPADEN);

	// set default buffer size allocations
	// see also: section 4.6.11.3.4, no fancy features like DCB and VTd
	set_reg32(dev->addr, IXGBE_TXPBSIZE(0), IXGBE_TXPBSIZE_40KB);
	for (int i = 1; i < 8; i++) {
		set_reg32(dev->addr, IXGBE_TXPBSIZE(i), 0);
	}
	// required when not using DCB/VTd
	set_reg32(dev->addr, IXGBE_DTXMXSZRQ, 0xFFFF);
	clear_flags32(dev->addr, IXGBE_RTTDCS, IXGBE_RTTDCS_ARBDIS);

	// per-queue config for all queues
	for (uint16_t i = 0; i < dev->ixy.num_tx_queues; i++) {
		debug("initializing tx queue %d", i);

		// setup descriptor ring, see section 7.1.9
		uint32_t ring_size_bytes = NUM_TX_QUEUE_ENTRIES * sizeof(union ixgbe_adv_tx_desc);
		struct dma_memory mem = memory_allocate_dma(ring_size_bytes, true);
		memset(mem.virt, -1, ring_size_bytes);
		// tell the device where it can write to (its iova, so its view)
		set_reg32(dev->addr, IXGBE_TDBAL(i), (uint32_t) (mem.phy & 0xFFFFFFFFull));
		set_reg32(dev->addr, IXGBE_TDBAH(i), (uint32_t) (mem.phy >> 32));
		set_reg32(dev->addr, IXGBE_TDLEN(i), ring_size_bytes);
		debug("tx ring %d phy addr:  0x%012lX", i, mem.phy);
		debug("tx ring %d virt addr: 0x%012lX", i, (uintptr_t) mem.virt);

		// descriptor writeback magic values, important to get good performance and low PCIe overhead
		// see 7.2.3.4.1 and 7.2.3.5 for an explanation of these values and how to find good ones
		// we just use the defaults from DPDK here, but this is a potentially interesting point for optimizations
		uint32_t txdctl = get_reg32(dev->addr, IXGBE_TXDCTL(i));
		// there are no defines for this in ixgbe_type.h for some reason
		// pthresh: 6:0, hthresh: 14:8, wthresh: 22:16
		txdctl &= ~(0x7F | (0x7F << 8) | (0x7F << 16)); // clear bits
		txdctl |= (36 | (8 << 8) | (4 << 16)); // from DPDK
		set_reg32(dev->addr, IXGBE_TXDCTL(i), txdctl);

		// private data for the driver, 0-initialized
		struct ixgbe_tx_queue* queue = ((struct ixgbe_tx_queue*)(dev->tx_queues)) + i;
		queue->num_entries = NUM_TX_QUEUE_ENTRIES;
		queue->descriptors = (union ixgbe_adv_tx_desc*) mem.virt;
	}
	// final step: enable DMA
	set_reg32(dev->addr, IXGBE_DMATXCTL, IXGBE_DMATXCTL_TE);
}